

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_verify.cpp
# Opt level: O2

void __thiscall embree::Scene::checkIfModifiedAndSet(Scene *this)

{
  _func_int **pp_Var1;
  atomic_bool aVar2;
  task *ptVar3;
  atomic_bool ret;
  auto_partitioner local_159;
  task_traits local_158;
  undefined8 local_150;
  undefined4 local_148;
  wait_context local_140;
  task_group_context local_130;
  task_group_context context;
  
  if (this[0x250] == (Scene)0x0) {
    pp_Var1 = *(_func_int ***)(this + 0x1d8);
    LOCK();
    ret._M_base._M_i = (__atomic_base<bool>)false;
    UNLOCK();
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    tbb::detail::d1::task_group_context::task_group_context(&local_130,PARALLEL_FOR);
    if (pp_Var1 != (_func_int **)0x0) {
      local_158.m_version_and_traits = 0;
      ptVar3 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_158,0xc0);
      ptVar3->m_reserved[3] = 0;
      ptVar3->m_reserved[4] = 0;
      ptVar3->m_reserved[5] = 0;
      ptVar3->m_reserved[1] = 0;
      ptVar3->m_reserved[2] = 0;
      (ptVar3->super_task_traits).m_version_and_traits = 0;
      ptVar3->m_reserved[0] = 0;
      ptVar3->_vptr_task = (_func_int **)&PTR__task_0024a9e8;
      ptVar3[1]._vptr_task = pp_Var1;
      ptVar3[1].super_task_traits.m_version_and_traits = 0;
      ptVar3[1].m_reserved[0] = 1;
      ptVar3[1].m_reserved[1] = (uint64_t)&ret;
      ptVar3[1].m_reserved[2] = (uint64_t)this;
      ptVar3[1].m_reserved[3] = (uint64_t)&context;
      tbb::detail::d1::auto_partition_type::auto_partition_type
                ((auto_partition_type *)(ptVar3[1].m_reserved + 5),&local_159);
      ptVar3[2].super_task_traits.m_version_and_traits = local_158.m_version_and_traits;
      local_150 = 0;
      local_148 = 1;
      local_140.m_version_and_traits = 1;
      local_140.m_ref_count.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)1;
      ptVar3[1].m_reserved[4] = (uint64_t)&local_150;
      tbb::detail::r1::execute_and_wait(ptVar3,&local_130,&local_140,&local_130);
    }
    tbb::detail::d1::task_group_context::~task_group_context(&local_130);
    aVar2 = ret;
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    if (((byte)aVar2._M_base._M_i & 1) != 0) {
      this[0x250] = (Scene)0x1;
    }
  }
  return;
}

Assistant:

void Scene::checkIfModifiedAndSet ()
{
  if (isModified ()) return;

  auto geometryIsModified = [this](size_t geomID)->bool {
    return isGeometryModified(geomID);
  };

  if (parallel_any_of (size_t(0), geometries.size (), geometryIsModified)) {
    setModified ();
  }
}